

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred_sse42_intr.c
# Opt level: O2

void ihevc_weighted_pred_bi_default_sse42
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  UWORD8 *pUVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  long lVar66;
  WORD16 *pWVar67;
  WORD16 *pWVar68;
  long lVar69;
  int iVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined4 uVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  
  if ((wd & 3U) != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_sse42_intr.c"
                  ,0x707,
                  "void ihevc_weighted_pred_bi_default_sse42(WORD16 *, WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if ((ht & 1U) == 0) {
    auVar74 = paddsw(ZEXT416((uint)lvl_shift2),ZEXT416((uint)lvl_shift1));
    auVar74 = pshuflw(ZEXT416((uint)lvl_shift1),auVar74,0);
    auVar74 = paddsw(auVar74,_DAT_0016b9f0);
    auVar74._4_4_ = auVar74._0_4_;
    auVar74._8_4_ = auVar74._0_4_;
    auVar74._12_4_ = auVar74._0_4_;
    if ((ht & 2U) == 0) {
      lVar73 = (long)(src_strd1 * 4);
      lVar72 = (long)(src_strd2 * 4);
      if ((wd & 0xcU) == 0) {
        lVar66 = (long)wd;
        for (iVar70 = 0; iVar70 < ht; iVar70 = iVar70 + 4) {
          pWVar67 = pi2_src2 + (lVar72 - lVar66);
          pWVar68 = pi2_src1 + (lVar73 - lVar66);
          for (lVar71 = 0; (int)lVar71 < wd; lVar71 = lVar71 + 0x10) {
            auVar75 = paddsw(*(undefined1 (*) [16])(pi2_src2 + lVar71),
                             *(undefined1 (*) [16])(pi2_src1 + lVar71));
            auVar79 = paddsw(*(undefined1 (*) [16])(pi2_src2 + lVar71 + 8),
                             *(undefined1 (*) [16])(pi2_src1 + lVar71 + 8));
            auVar76 = paddsw(*(undefined1 (*) [16])(pi2_src2 + src_strd2 + lVar71),
                             *(undefined1 (*) [16])(pi2_src1 + src_strd1 + lVar71));
            auVar80 = paddsw(*(undefined1 (*) [16])(pi2_src2 + (long)src_strd2 + lVar71 + 8),
                             *(undefined1 (*) [16])(pi2_src1 + (long)src_strd1 + lVar71 + 8));
            auVar78 = paddsw(*(undefined1 (*) [16])(pi2_src2 + src_strd2 * 2 + lVar71),
                             *(undefined1 (*) [16])(pi2_src1 + src_strd1 * 2 + lVar71));
            auVar82 = paddsw(*(undefined1 (*) [16])(pi2_src2 + (long)(src_strd2 * 2) + lVar71 + 8),
                             *(undefined1 (*) [16])(pi2_src1 + (long)(src_strd1 * 2) + lVar71 + 8));
            auVar81 = paddsw(*(undefined1 (*) [16])(pi2_src2 + src_strd2 * 3 + lVar71),
                             *(undefined1 (*) [16])(pi2_src1 + src_strd1 * 3 + lVar71));
            auVar83 = paddsw(*(undefined1 (*) [16])(pi2_src2 + (long)(src_strd2 * 3) + lVar71 + 8),
                             *(undefined1 (*) [16])(pi2_src1 + (long)(src_strd1 * 3) + lVar71 + 8));
            auVar75 = paddsw(auVar75,auVar74);
            auVar76 = paddsw(auVar76,auVar74);
            auVar78 = paddsw(auVar78,auVar74);
            auVar81 = paddsw(auVar81,auVar74);
            auVar75 = psraw(auVar75,7);
            auVar76 = psraw(auVar76,7);
            auVar78 = psraw(auVar78,7);
            auVar81 = psraw(auVar81,7);
            auVar79 = paddsw(auVar79,auVar74);
            auVar80 = paddsw(auVar80,auVar74);
            auVar82 = paddsw(auVar82,auVar74);
            auVar83 = paddsw(auVar83,auVar74);
            auVar79 = psraw(auVar79,7);
            sVar2 = auVar75._0_2_;
            sVar6 = auVar75._2_2_;
            sVar10 = auVar75._4_2_;
            sVar14 = auVar75._6_2_;
            sVar18 = auVar75._8_2_;
            sVar22 = auVar75._10_2_;
            sVar26 = auVar75._12_2_;
            sVar30 = auVar75._14_2_;
            sVar34 = auVar79._0_2_;
            sVar38 = auVar79._2_2_;
            sVar42 = auVar79._4_2_;
            sVar46 = auVar79._6_2_;
            sVar50 = auVar79._8_2_;
            sVar54 = auVar79._10_2_;
            sVar58 = auVar79._12_2_;
            sVar62 = auVar79._14_2_;
            auVar80 = psraw(auVar80,7);
            sVar3 = auVar76._0_2_;
            sVar7 = auVar76._2_2_;
            sVar11 = auVar76._4_2_;
            sVar15 = auVar76._6_2_;
            sVar19 = auVar76._8_2_;
            sVar23 = auVar76._10_2_;
            sVar27 = auVar76._12_2_;
            sVar31 = auVar76._14_2_;
            sVar35 = auVar80._0_2_;
            sVar39 = auVar80._2_2_;
            sVar43 = auVar80._4_2_;
            sVar47 = auVar80._6_2_;
            sVar51 = auVar80._8_2_;
            sVar55 = auVar80._10_2_;
            sVar59 = auVar80._12_2_;
            sVar63 = auVar80._14_2_;
            auVar82 = psraw(auVar82,7);
            sVar4 = auVar78._0_2_;
            sVar8 = auVar78._2_2_;
            sVar12 = auVar78._4_2_;
            sVar16 = auVar78._6_2_;
            sVar20 = auVar78._8_2_;
            sVar24 = auVar78._10_2_;
            sVar28 = auVar78._12_2_;
            sVar32 = auVar78._14_2_;
            sVar36 = auVar82._0_2_;
            sVar40 = auVar82._2_2_;
            sVar44 = auVar82._4_2_;
            sVar48 = auVar82._6_2_;
            sVar52 = auVar82._8_2_;
            sVar56 = auVar82._10_2_;
            sVar60 = auVar82._12_2_;
            sVar64 = auVar82._14_2_;
            auVar83 = psraw(auVar83,7);
            sVar5 = auVar81._0_2_;
            sVar9 = auVar81._2_2_;
            sVar13 = auVar81._4_2_;
            sVar17 = auVar81._6_2_;
            sVar21 = auVar81._8_2_;
            sVar25 = auVar81._10_2_;
            sVar29 = auVar81._12_2_;
            sVar33 = auVar81._14_2_;
            sVar37 = auVar83._0_2_;
            sVar41 = auVar83._2_2_;
            sVar45 = auVar83._4_2_;
            sVar49 = auVar83._6_2_;
            sVar53 = auVar83._8_2_;
            sVar57 = auVar83._10_2_;
            sVar61 = auVar83._12_2_;
            sVar65 = auVar83._14_2_;
            pUVar1 = pu1_dst + lVar71;
            *pUVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar75[0] - (0xff < sVar2);
            pUVar1[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar75[2] - (0xff < sVar6);
            pUVar1[2] = (0 < sVar10) * (sVar10 < 0x100) * auVar75[4] - (0xff < sVar10);
            pUVar1[3] = (0 < sVar14) * (sVar14 < 0x100) * auVar75[6] - (0xff < sVar14);
            pUVar1[4] = (0 < sVar18) * (sVar18 < 0x100) * auVar75[8] - (0xff < sVar18);
            pUVar1[5] = (0 < sVar22) * (sVar22 < 0x100) * auVar75[10] - (0xff < sVar22);
            pUVar1[6] = (0 < sVar26) * (sVar26 < 0x100) * auVar75[0xc] - (0xff < sVar26);
            pUVar1[7] = (0 < sVar30) * (sVar30 < 0x100) * auVar75[0xe] - (0xff < sVar30);
            pUVar1[8] = (0 < sVar34) * (sVar34 < 0x100) * auVar79[0] - (0xff < sVar34);
            pUVar1[9] = (0 < sVar38) * (sVar38 < 0x100) * auVar79[2] - (0xff < sVar38);
            pUVar1[10] = (0 < sVar42) * (sVar42 < 0x100) * auVar79[4] - (0xff < sVar42);
            pUVar1[0xb] = (0 < sVar46) * (sVar46 < 0x100) * auVar79[6] - (0xff < sVar46);
            pUVar1[0xc] = (0 < sVar50) * (sVar50 < 0x100) * auVar79[8] - (0xff < sVar50);
            pUVar1[0xd] = (0 < sVar54) * (sVar54 < 0x100) * auVar79[10] - (0xff < sVar54);
            pUVar1[0xe] = (0 < sVar58) * (sVar58 < 0x100) * auVar79[0xc] - (0xff < sVar58);
            pUVar1[0xf] = (0 < sVar62) * (sVar62 < 0x100) * auVar79[0xe] - (0xff < sVar62);
            pUVar1 = pu1_dst + lVar71 + dst_strd;
            *pUVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar76[0] - (0xff < sVar3);
            pUVar1[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar76[2] - (0xff < sVar7);
            pUVar1[2] = (0 < sVar11) * (sVar11 < 0x100) * auVar76[4] - (0xff < sVar11);
            pUVar1[3] = (0 < sVar15) * (sVar15 < 0x100) * auVar76[6] - (0xff < sVar15);
            pUVar1[4] = (0 < sVar19) * (sVar19 < 0x100) * auVar76[8] - (0xff < sVar19);
            pUVar1[5] = (0 < sVar23) * (sVar23 < 0x100) * auVar76[10] - (0xff < sVar23);
            pUVar1[6] = (0 < sVar27) * (sVar27 < 0x100) * auVar76[0xc] - (0xff < sVar27);
            pUVar1[7] = (0 < sVar31) * (sVar31 < 0x100) * auVar76[0xe] - (0xff < sVar31);
            pUVar1[8] = (0 < sVar35) * (sVar35 < 0x100) * auVar80[0] - (0xff < sVar35);
            pUVar1[9] = (0 < sVar39) * (sVar39 < 0x100) * auVar80[2] - (0xff < sVar39);
            pUVar1[10] = (0 < sVar43) * (sVar43 < 0x100) * auVar80[4] - (0xff < sVar43);
            pUVar1[0xb] = (0 < sVar47) * (sVar47 < 0x100) * auVar80[6] - (0xff < sVar47);
            pUVar1[0xc] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[8] - (0xff < sVar51);
            pUVar1[0xd] = (0 < sVar55) * (sVar55 < 0x100) * auVar80[10] - (0xff < sVar55);
            pUVar1[0xe] = (0 < sVar59) * (sVar59 < 0x100) * auVar80[0xc] - (0xff < sVar59);
            pUVar1[0xf] = (0 < sVar63) * (sVar63 < 0x100) * auVar80[0xe] - (0xff < sVar63);
            pUVar1 = pu1_dst + lVar71 + dst_strd * 2;
            *pUVar1 = (0 < sVar4) * (sVar4 < 0x100) * auVar78[0] - (0xff < sVar4);
            pUVar1[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar78[2] - (0xff < sVar8);
            pUVar1[2] = (0 < sVar12) * (sVar12 < 0x100) * auVar78[4] - (0xff < sVar12);
            pUVar1[3] = (0 < sVar16) * (sVar16 < 0x100) * auVar78[6] - (0xff < sVar16);
            pUVar1[4] = (0 < sVar20) * (sVar20 < 0x100) * auVar78[8] - (0xff < sVar20);
            pUVar1[5] = (0 < sVar24) * (sVar24 < 0x100) * auVar78[10] - (0xff < sVar24);
            pUVar1[6] = (0 < sVar28) * (sVar28 < 0x100) * auVar78[0xc] - (0xff < sVar28);
            pUVar1[7] = (0 < sVar32) * (sVar32 < 0x100) * auVar78[0xe] - (0xff < sVar32);
            pUVar1[8] = (0 < sVar36) * (sVar36 < 0x100) * auVar82[0] - (0xff < sVar36);
            pUVar1[9] = (0 < sVar40) * (sVar40 < 0x100) * auVar82[2] - (0xff < sVar40);
            pUVar1[10] = (0 < sVar44) * (sVar44 < 0x100) * auVar82[4] - (0xff < sVar44);
            pUVar1[0xb] = (0 < sVar48) * (sVar48 < 0x100) * auVar82[6] - (0xff < sVar48);
            pUVar1[0xc] = (0 < sVar52) * (sVar52 < 0x100) * auVar82[8] - (0xff < sVar52);
            pUVar1[0xd] = (0 < sVar56) * (sVar56 < 0x100) * auVar82[10] - (0xff < sVar56);
            pUVar1[0xe] = (0 < sVar60) * (sVar60 < 0x100) * auVar82[0xc] - (0xff < sVar60);
            pUVar1[0xf] = (0 < sVar64) * (sVar64 < 0x100) * auVar82[0xe] - (0xff < sVar64);
            pUVar1 = pu1_dst + lVar71 + dst_strd * 3;
            *pUVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar81[0] - (0xff < sVar5);
            pUVar1[1] = (0 < sVar9) * (sVar9 < 0x100) * auVar81[2] - (0xff < sVar9);
            pUVar1[2] = (0 < sVar13) * (sVar13 < 0x100) * auVar81[4] - (0xff < sVar13);
            pUVar1[3] = (0 < sVar17) * (sVar17 < 0x100) * auVar81[6] - (0xff < sVar17);
            pUVar1[4] = (0 < sVar21) * (sVar21 < 0x100) * auVar81[8] - (0xff < sVar21);
            pUVar1[5] = (0 < sVar25) * (sVar25 < 0x100) * auVar81[10] - (0xff < sVar25);
            pUVar1[6] = (0 < sVar29) * (sVar29 < 0x100) * auVar81[0xc] - (0xff < sVar29);
            pUVar1[7] = (0 < sVar33) * (sVar33 < 0x100) * auVar81[0xe] - (0xff < sVar33);
            pUVar1[8] = (0 < sVar37) * (sVar37 < 0x100) * auVar83[0] - (0xff < sVar37);
            pUVar1[9] = (0 < sVar41) * (sVar41 < 0x100) * auVar83[2] - (0xff < sVar41);
            pUVar1[10] = (0 < sVar45) * (sVar45 < 0x100) * auVar83[4] - (0xff < sVar45);
            pUVar1[0xb] = (0 < sVar49) * (sVar49 < 0x100) * auVar83[6] - (0xff < sVar49);
            pUVar1[0xc] = (0 < sVar53) * (sVar53 < 0x100) * auVar83[8] - (0xff < sVar53);
            pUVar1[0xd] = (0 < sVar57) * (sVar57 < 0x100) * auVar83[10] - (0xff < sVar57);
            pUVar1[0xe] = (0 < sVar61) * (sVar61 < 0x100) * auVar83[0xc] - (0xff < sVar61);
            pUVar1[0xf] = (0 < sVar65) * (sVar65 < 0x100) * auVar83[0xe] - (0xff < sVar65);
            pWVar67 = pWVar67 + 0x10;
            pWVar68 = pWVar68 + 0x10;
          }
          pu1_dst = pu1_dst + lVar71 + (dst_strd * 4 - lVar66);
          pi2_src2 = pWVar67;
          pi2_src1 = pWVar68;
        }
      }
      else {
        lVar66 = (long)wd;
        lVar71 = dst_strd * 4 - lVar66;
        if ((wd & 4U) == 0) {
          for (iVar70 = 0; iVar70 < ht; iVar70 = iVar70 + 4) {
            pWVar67 = pi2_src2 + (lVar72 - lVar66);
            pWVar68 = pi2_src1 + (lVar73 - lVar66);
            for (lVar69 = 0; (int)lVar69 < wd; lVar69 = lVar69 + 8) {
              auVar75 = paddsw(*(undefined1 (*) [16])(pi2_src2 + lVar69),
                               *(undefined1 (*) [16])(pi2_src1 + lVar69));
              auVar76 = paddsw(*(undefined1 (*) [16])(pi2_src2 + src_strd2 + lVar69),
                               *(undefined1 (*) [16])(pi2_src1 + src_strd1 + lVar69));
              auVar78 = paddsw(*(undefined1 (*) [16])(pi2_src2 + src_strd2 * 2 + lVar69),
                               *(undefined1 (*) [16])(pi2_src1 + src_strd1 * 2 + lVar69));
              auVar79 = paddsw(*(undefined1 (*) [16])(pi2_src2 + src_strd2 * 3 + lVar69),
                               *(undefined1 (*) [16])(pi2_src1 + src_strd1 * 3 + lVar69));
              auVar75 = paddsw(auVar75,auVar74);
              auVar76 = paddsw(auVar76,auVar74);
              auVar78 = paddsw(auVar78,auVar74);
              auVar79 = paddsw(auVar79,auVar74);
              auVar75 = psraw(auVar75,7);
              sVar2 = auVar75._0_2_;
              sVar6 = auVar75._2_2_;
              sVar10 = auVar75._4_2_;
              sVar14 = auVar75._6_2_;
              sVar18 = auVar75._8_2_;
              sVar22 = auVar75._10_2_;
              sVar26 = auVar75._12_2_;
              sVar30 = auVar75._14_2_;
              auVar76 = psraw(auVar76,7);
              sVar3 = auVar76._0_2_;
              sVar7 = auVar76._2_2_;
              sVar11 = auVar76._4_2_;
              sVar15 = auVar76._6_2_;
              sVar19 = auVar76._8_2_;
              sVar23 = auVar76._10_2_;
              sVar27 = auVar76._12_2_;
              sVar31 = auVar76._14_2_;
              auVar78 = psraw(auVar78,7);
              sVar4 = auVar78._0_2_;
              sVar8 = auVar78._2_2_;
              sVar12 = auVar78._4_2_;
              sVar16 = auVar78._6_2_;
              sVar20 = auVar78._8_2_;
              sVar24 = auVar78._10_2_;
              sVar28 = auVar78._12_2_;
              sVar32 = auVar78._14_2_;
              auVar79 = psraw(auVar79,7);
              sVar5 = auVar79._0_2_;
              sVar9 = auVar79._2_2_;
              sVar13 = auVar79._4_2_;
              sVar17 = auVar79._6_2_;
              sVar21 = auVar79._8_2_;
              sVar25 = auVar79._10_2_;
              sVar29 = auVar79._12_2_;
              sVar33 = auVar79._14_2_;
              *(ulong *)(pu1_dst + lVar69) =
                   CONCAT17((0 < sVar30) * (sVar30 < 0x100) * auVar75[0xe] - (0xff < sVar30),
                            CONCAT16((0 < sVar26) * (sVar26 < 0x100) * auVar75[0xc] -
                                     (0xff < sVar26),
                                     CONCAT15((0 < sVar22) * (sVar22 < 0x100) * auVar75[10] -
                                              (0xff < sVar22),
                                              CONCAT14((0 < sVar18) * (sVar18 < 0x100) * auVar75[8]
                                                       - (0xff < sVar18),
                                                       CONCAT13((0 < sVar14) * (sVar14 < 0x100) *
                                                                auVar75[6] - (0xff < sVar14),
                                                                CONCAT12((0 < sVar10) *
                                                                         (sVar10 < 0x100) *
                                                                         auVar75[4] -
                                                                         (0xff < sVar10),
                                                                         CONCAT11((0 < sVar6) *
                                                                                  (sVar6 < 0x100) *
                                                                                  auVar75[2] -
                                                                                  (0xff < sVar6),
                                                                                  (0 < sVar2) *
                                                                                  (sVar2 < 0x100) *
                                                                                  auVar75[0] -
                                                                                  (0xff < sVar2)))))
                                             )));
              *(ulong *)(pu1_dst + lVar69 + dst_strd) =
                   CONCAT17((0 < sVar31) * (sVar31 < 0x100) * auVar76[0xe] - (0xff < sVar31),
                            CONCAT16((0 < sVar27) * (sVar27 < 0x100) * auVar76[0xc] -
                                     (0xff < sVar27),
                                     CONCAT15((0 < sVar23) * (sVar23 < 0x100) * auVar76[10] -
                                              (0xff < sVar23),
                                              CONCAT14((0 < sVar19) * (sVar19 < 0x100) * auVar76[8]
                                                       - (0xff < sVar19),
                                                       CONCAT13((0 < sVar15) * (sVar15 < 0x100) *
                                                                auVar76[6] - (0xff < sVar15),
                                                                CONCAT12((0 < sVar11) *
                                                                         (sVar11 < 0x100) *
                                                                         auVar76[4] -
                                                                         (0xff < sVar11),
                                                                         CONCAT11((0 < sVar7) *
                                                                                  (sVar7 < 0x100) *
                                                                                  auVar76[2] -
                                                                                  (0xff < sVar7),
                                                                                  (0 < sVar3) *
                                                                                  (sVar3 < 0x100) *
                                                                                  auVar76[0] -
                                                                                  (0xff < sVar3)))))
                                             )));
              *(ulong *)(pu1_dst + lVar69 + dst_strd * 2) =
                   CONCAT17((0 < sVar32) * (sVar32 < 0x100) * auVar78[0xe] - (0xff < sVar32),
                            CONCAT16((0 < sVar28) * (sVar28 < 0x100) * auVar78[0xc] -
                                     (0xff < sVar28),
                                     CONCAT15((0 < sVar24) * (sVar24 < 0x100) * auVar78[10] -
                                              (0xff < sVar24),
                                              CONCAT14((0 < sVar20) * (sVar20 < 0x100) * auVar78[8]
                                                       - (0xff < sVar20),
                                                       CONCAT13((0 < sVar16) * (sVar16 < 0x100) *
                                                                auVar78[6] - (0xff < sVar16),
                                                                CONCAT12((0 < sVar12) *
                                                                         (sVar12 < 0x100) *
                                                                         auVar78[4] -
                                                                         (0xff < sVar12),
                                                                         CONCAT11((0 < sVar8) *
                                                                                  (sVar8 < 0x100) *
                                                                                  auVar78[2] -
                                                                                  (0xff < sVar8),
                                                                                  (0 < sVar4) *
                                                                                  (sVar4 < 0x100) *
                                                                                  auVar78[0] -
                                                                                  (0xff < sVar4)))))
                                             )));
              *(ulong *)(pu1_dst + lVar69 + dst_strd * 3) =
                   CONCAT17((0 < sVar33) * (sVar33 < 0x100) * auVar79[0xe] - (0xff < sVar33),
                            CONCAT16((0 < sVar29) * (sVar29 < 0x100) * auVar79[0xc] -
                                     (0xff < sVar29),
                                     CONCAT15((0 < sVar25) * (sVar25 < 0x100) * auVar79[10] -
                                              (0xff < sVar25),
                                              CONCAT14((0 < sVar21) * (sVar21 < 0x100) * auVar79[8]
                                                       - (0xff < sVar21),
                                                       CONCAT13((0 < sVar17) * (sVar17 < 0x100) *
                                                                auVar79[6] - (0xff < sVar17),
                                                                CONCAT12((0 < sVar13) *
                                                                         (sVar13 < 0x100) *
                                                                         auVar79[4] -
                                                                         (0xff < sVar13),
                                                                         CONCAT11((0 < sVar9) *
                                                                                  (sVar9 < 0x100) *
                                                                                  auVar79[2] -
                                                                                  (0xff < sVar9),
                                                                                  (0 < sVar5) *
                                                                                  (sVar5 < 0x100) *
                                                                                  auVar79[0] -
                                                                                  (0xff < sVar5)))))
                                             )));
              pWVar67 = pWVar67 + 8;
              pWVar68 = pWVar68 + 8;
            }
            pu1_dst = pu1_dst + lVar69 + lVar71;
            pi2_src2 = pWVar67;
            pi2_src1 = pWVar68;
          }
        }
        else {
          for (iVar70 = 0; iVar70 < ht; iVar70 = iVar70 + 4) {
            pWVar67 = pi2_src2 + (lVar72 - lVar66);
            pWVar68 = pi2_src1 + (lVar73 - lVar66);
            for (lVar69 = 0; (int)lVar69 < wd; lVar69 = lVar69 + 4) {
              auVar78._8_8_ = *(undefined8 *)(pi2_src1 + src_strd1 + lVar69);
              auVar78._0_8_ = *(undefined8 *)(pi2_src1 + lVar69);
              auVar80._8_8_ = *(undefined8 *)(pi2_src2 + src_strd2 + lVar69);
              auVar80._0_8_ = *(undefined8 *)(pi2_src2 + lVar69);
              auVar75 = paddsw(auVar80,auVar78);
              auVar79._8_8_ = *(undefined8 *)(pi2_src1 + src_strd1 * 3 + lVar69);
              auVar79._0_8_ = *(undefined8 *)(pi2_src1 + src_strd1 * 2 + lVar69);
              auVar81._8_8_ = *(undefined8 *)(pi2_src2 + src_strd2 * 3 + lVar69);
              auVar81._0_8_ = *(undefined8 *)(pi2_src2 + src_strd2 * 2 + lVar69);
              auVar76 = paddsw(auVar81,auVar79);
              auVar75 = paddsw(auVar75,auVar74);
              auVar75 = psraw(auVar75,7);
              sVar2 = auVar75._0_2_;
              sVar3 = auVar75._2_2_;
              sVar4 = auVar75._4_2_;
              sVar5 = auVar75._6_2_;
              uVar77 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar75[6] - (0xff < sVar5),
                                CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar75[4] - (0xff < sVar4)
                                         ,CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar75[2] -
                                                   (0xff < sVar3),
                                                   (0 < sVar2) * (sVar2 < 0x100) * auVar75[0] -
                                                   (0xff < sVar2))));
              sVar2 = auVar75._8_2_;
              sVar3 = auVar75._10_2_;
              sVar4 = auVar75._12_2_;
              sVar5 = auVar75._14_2_;
              *(undefined4 *)(pu1_dst + lVar69) = uVar77;
              *(int *)(pu1_dst + lVar69 + dst_strd) =
                   (int)(CONCAT17((0 < sVar5) * (sVar5 < 0x100) * auVar75[0xe] - (0xff < sVar5),
                                  CONCAT16((0 < sVar4) * (sVar4 < 0x100) * auVar75[0xc] -
                                           (0xff < sVar4),
                                           CONCAT15((0 < sVar3) * (sVar3 < 0x100) * auVar75[10] -
                                                    (0xff < sVar3),
                                                    CONCAT14((0 < sVar2) * (sVar2 < 0x100) *
                                                             auVar75[8] - (0xff < sVar2),uVar77))))
                        >> 0x20);
              auVar75 = paddsw(auVar76,auVar74);
              auVar75 = psraw(auVar75,7);
              sVar2 = auVar75._0_2_;
              sVar3 = auVar75._2_2_;
              sVar4 = auVar75._4_2_;
              sVar5 = auVar75._6_2_;
              uVar77 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar75[6] - (0xff < sVar5),
                                CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar75[4] - (0xff < sVar4)
                                         ,CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar75[2] -
                                                   (0xff < sVar3),
                                                   (0 < sVar2) * (sVar2 < 0x100) * auVar75[0] -
                                                   (0xff < sVar2))));
              sVar2 = auVar75._8_2_;
              sVar3 = auVar75._10_2_;
              sVar4 = auVar75._12_2_;
              sVar5 = auVar75._14_2_;
              *(undefined4 *)(pu1_dst + lVar69 + dst_strd * 2) = uVar77;
              *(int *)(pu1_dst + lVar69 + dst_strd * 3) =
                   (int)(CONCAT17((0 < sVar5) * (sVar5 < 0x100) * auVar75[0xe] - (0xff < sVar5),
                                  CONCAT16((0 < sVar4) * (sVar4 < 0x100) * auVar75[0xc] -
                                           (0xff < sVar4),
                                           CONCAT15((0 < sVar3) * (sVar3 < 0x100) * auVar75[10] -
                                                    (0xff < sVar3),
                                                    CONCAT14((0 < sVar2) * (sVar2 < 0x100) *
                                                             auVar75[8] - (0xff < sVar2),uVar77))))
                        >> 0x20);
              pWVar67 = pWVar67 + 4;
              pWVar68 = pWVar68 + 4;
            }
            pu1_dst = pu1_dst + lVar69 + lVar71;
            pi2_src2 = pWVar67;
            pi2_src1 = pWVar68;
          }
        }
      }
    }
    else {
      lVar72 = (long)wd;
      for (iVar70 = 0; iVar70 < ht; iVar70 = iVar70 + 2) {
        pWVar67 = pi2_src2 + (src_strd2 * 2 - lVar72);
        pWVar68 = pi2_src1 + (src_strd1 * 2 - lVar72);
        for (lVar73 = 0; (int)lVar73 < wd; lVar73 = lVar73 + 4) {
          auVar75._8_8_ = *(undefined8 *)(pi2_src1 + src_strd1 + lVar73);
          auVar75._0_8_ = *(undefined8 *)(pi2_src1 + lVar73);
          auVar76._8_8_ = *(undefined8 *)(pi2_src2 + src_strd2 + lVar73);
          auVar76._0_8_ = *(undefined8 *)(pi2_src2 + lVar73);
          auVar75 = paddsw(auVar76,auVar75);
          auVar75 = paddsw(auVar75,auVar74);
          auVar75 = psraw(auVar75,7);
          sVar2 = auVar75._0_2_;
          sVar3 = auVar75._2_2_;
          sVar4 = auVar75._4_2_;
          sVar5 = auVar75._6_2_;
          uVar77 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar75[6] - (0xff < sVar5),
                            CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar75[4] - (0xff < sVar4),
                                     CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar75[2] -
                                              (0xff < sVar3),
                                              (0 < sVar2) * (sVar2 < 0x100) * auVar75[0] -
                                              (0xff < sVar2))));
          sVar2 = auVar75._8_2_;
          sVar3 = auVar75._10_2_;
          sVar4 = auVar75._12_2_;
          sVar5 = auVar75._14_2_;
          *(undefined4 *)(pu1_dst + lVar73) = uVar77;
          *(int *)(pu1_dst + lVar73 + dst_strd) =
               (int)(CONCAT17((0 < sVar5) * (sVar5 < 0x100) * auVar75[0xe] - (0xff < sVar5),
                              CONCAT16((0 < sVar4) * (sVar4 < 0x100) * auVar75[0xc] - (0xff < sVar4)
                                       ,CONCAT15((0 < sVar3) * (sVar3 < 0x100) * auVar75[10] -
                                                 (0xff < sVar3),
                                                 CONCAT14((0 < sVar2) * (sVar2 < 0x100) * auVar75[8]
                                                          - (0xff < sVar2),uVar77)))) >> 0x20);
          pWVar67 = pWVar67 + 4;
          pWVar68 = pWVar68 + 4;
        }
        pu1_dst = pu1_dst + lVar73 + (dst_strd * 2 - lVar72);
        pi2_src2 = pWVar67;
        pi2_src1 = pWVar68;
      }
    }
    return;
  }
  __assert_fail("(ht % 2 == 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_sse42_intr.c"
                ,0x708,
                "void ihevc_weighted_pred_bi_default_sse42(WORD16 *, WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_weighted_pred_bi_default_sse42(WORD16 *pi2_src1,
                                          WORD16 *pi2_src2,
                                          UWORD8 *pu1_dst,
                                          WORD32 src_strd1,
                                          WORD32 src_strd2,
                                          WORD32 dst_strd,
                                          WORD32 lvl_shift1,
                                          WORD32 lvl_shift2,
                                          WORD32 ht,
                                          WORD32 wd)
{
    WORD32 row, col, temp;
    WORD32 shift;

    __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
    __m128i const_temp_8x16b, lvl_shift1_8x16b, lvl_shift2_8x16b;
    __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;

    ASSERT(wd % 4 == 0); /* checking assumption*/
    ASSERT(ht % 2 == 0); /* checking assumption*/

    shift = SHIFT_14_MINUS_BIT_DEPTH + 1;
    temp = 1 << (shift - 1);

    // seting values in register
    lvl_shift1_8x16b = _mm_set1_epi16(lvl_shift1);
    lvl_shift2_8x16b = _mm_set1_epi16(lvl_shift2);
    const_temp_8x16b = _mm_set1_epi16(temp);

    lvl_shift1_8x16b = _mm_adds_epi16(lvl_shift1_8x16b, lvl_shift2_8x16b);
    lvl_shift1_8x16b = _mm_adds_epi16(lvl_shift1_8x16b, const_temp_8x16b);

    if(0 == (ht & 3)) /* ht multiple of 4*/
    {
        if(0 == (wd & 15)) /* wd multiple of 16 case */
        {
            __m128i src_temp9_8x16b,  src_temp10_8x16b, src_temp11_8x16b, src_temp12_8x16b;
            __m128i src_temp13_8x16b, src_temp14_8x16b, src_temp15_8x16b, src_temp16_8x16b;
            /*  outer for loop starts from here */
            for(row = 0; row < ht; row += 4)
            {
                for(col = 0; col < wd; col += 16)
                {
                    /*load 8 pixel values */ /* First 8 Values */
                    src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1));
                    src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2));
                    /* row = 1 */
                    src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + src_strd1));
                    src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + src_strd2));
                    /* row = 2 */
                    src_temp5_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 2 * src_strd1));
                    src_temp6_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 2 * src_strd2));
                    /* row = 3 */
                    src_temp7_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 3 * src_strd1));
                    src_temp8_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 3 * src_strd2));

                    /*load 8 pixel values */ /* Second 8 Values */
                    src_temp9_8x16b  = _mm_loadu_si128((__m128i *)(pi2_src1 + 8));
                    src_temp10_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 8));
                    /* row = 1 */
                    src_temp11_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + src_strd1 + 8));
                    src_temp12_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + src_strd2 + 8));
                    /* row = 2 */
                    src_temp13_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 2 * src_strd1 + 8));
                    src_temp14_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 2 * src_strd2 + 8));

                    /* (pi2_src1[col] + pi2_src2[col]) */ /* First 8 Values */
                    src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, src_temp2_8x16b);
                    src_temp3_8x16b = _mm_adds_epi16(src_temp3_8x16b, src_temp4_8x16b);
                    src_temp5_8x16b = _mm_adds_epi16(src_temp5_8x16b, src_temp6_8x16b);
                    src_temp7_8x16b = _mm_adds_epi16(src_temp7_8x16b, src_temp8_8x16b);

                    /*load 8 pixel values */ /* Second 8 Values */
                    /* row = 3 */
                    src_temp15_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 3 * src_strd1 + 8));
                    src_temp16_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 3 * src_strd2 + 8));

                    /* i4_tmp = (pi2_src1[col] + pi2_src2[col] + lvl_shift1 + lvl_shift2 + shift_value) */ /* First 8 Values */
                    src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, lvl_shift1_8x16b);
                    src_temp3_8x16b = _mm_adds_epi16(src_temp3_8x16b, lvl_shift1_8x16b);
                    src_temp5_8x16b = _mm_adds_epi16(src_temp5_8x16b, lvl_shift1_8x16b);
                    src_temp7_8x16b = _mm_adds_epi16(src_temp7_8x16b, lvl_shift1_8x16b);

                    /* (pi2_src1[col] + pi2_src2[col]) */ /* Second 8 Values */
                    src_temp9_8x16b  = _mm_adds_epi16(src_temp9_8x16b,  src_temp10_8x16b);
                    src_temp11_8x16b = _mm_adds_epi16(src_temp11_8x16b, src_temp12_8x16b);
                    src_temp13_8x16b = _mm_adds_epi16(src_temp13_8x16b, src_temp14_8x16b);
                    src_temp15_8x16b = _mm_adds_epi16(src_temp15_8x16b, src_temp16_8x16b);

                    /* (i4_tmp >> shift) */ /* First 8 Values */
                    src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  shift);
                    src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  shift);
                    src_temp5_8x16b = _mm_srai_epi16(src_temp5_8x16b,  shift);
                    src_temp7_8x16b = _mm_srai_epi16(src_temp7_8x16b,  shift);

                    /* i4_tmp = (pi2_src1[col] + pi2_src2[col] + lvl_shift1 + lvl_shift2 + shift_value) */ /* Second 8 Values */
                    src_temp9_8x16b  = _mm_adds_epi16(src_temp9_8x16b, lvl_shift1_8x16b);
                    src_temp11_8x16b = _mm_adds_epi16(src_temp11_8x16b, lvl_shift1_8x16b);
                    src_temp13_8x16b = _mm_adds_epi16(src_temp13_8x16b, lvl_shift1_8x16b);
                    src_temp15_8x16b = _mm_adds_epi16(src_temp15_8x16b, lvl_shift1_8x16b);

                    /* (i4_tmp >> shift) */ /* Second 8 Values */
                    src_temp9_8x16b  = _mm_srai_epi16(src_temp9_8x16b,  shift);
                    src_temp11_8x16b = _mm_srai_epi16(src_temp11_8x16b,  shift);
                    src_temp13_8x16b = _mm_srai_epi16(src_temp13_8x16b,  shift);
                    src_temp15_8x16b = _mm_srai_epi16(src_temp15_8x16b,  shift);

                    /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */ /* 16 8 Values */
                    src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp9_8x16b);
                    src_temp3_8x16b = _mm_packus_epi16(src_temp3_8x16b, src_temp11_8x16b);
                    src_temp5_8x16b = _mm_packus_epi16(src_temp5_8x16b, src_temp13_8x16b);
                    src_temp7_8x16b = _mm_packus_epi16(src_temp7_8x16b, src_temp15_8x16b);

                    /* store four 8-bit output values  */ /* 16 8 Values */
                    _mm_storeu_si128((__m128i *)(pu1_dst + 0 * dst_strd), src_temp1_8x16b); /* row = 0*/
                    _mm_storeu_si128((__m128i *)(pu1_dst + 1 * dst_strd), src_temp3_8x16b); /* row = 2*/
                    _mm_storeu_si128((__m128i *)(pu1_dst + 2 * dst_strd), src_temp5_8x16b); /* row = 1*/
                    _mm_storeu_si128((__m128i *)(pu1_dst + 3 * dst_strd), src_temp7_8x16b); /* row = 3*/

                    /* To update pointer */
                    pi2_src1 += 16;
                    pi2_src2 += 16;
                    pu1_dst  += 16;

                } /* inner loop ends here(8-output values in single iteration) */

                pi2_src1 = pi2_src1 - wd + 4 * src_strd1;  /* Pointer update */
                pi2_src2 = pi2_src2 - wd + 4 * src_strd2;  /* Pointer update */
                pu1_dst  = pu1_dst - wd + 4 * dst_strd;   /* Pointer update */

            }
        }
        else if(0 == (wd & 7)) /* multiple of 8 case */
        {
            /*  outer for loop starts from here */
            for(row = 0; row < ht; row += 4)
            {
                for(col = 0; col < wd; col += 8)
                {
                    /*load 8 pixel values */
                    src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1));
                    src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2));
                    /* row = 1 */
                    src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + src_strd1));
                    src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + src_strd2));
                    /* row = 2 */
                    src_temp5_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 2 * src_strd1));
                    src_temp6_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 2 * src_strd2));
                    /* row = 3 */
                    src_temp7_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 3 * src_strd1));
                    src_temp8_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 3 * src_strd2));

                    /* (pi2_src1[col] + pi2_src2[col]) */
                    src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, src_temp2_8x16b);
                    src_temp3_8x16b = _mm_adds_epi16(src_temp3_8x16b, src_temp4_8x16b);
                    src_temp5_8x16b = _mm_adds_epi16(src_temp5_8x16b, src_temp6_8x16b);
                    src_temp7_8x16b = _mm_adds_epi16(src_temp7_8x16b, src_temp8_8x16b);

                    /* i4_tmp = (pi2_src1[col] + pi2_src2[col] + lvl_shift1 + lvl_shift2 + shift_value) */
                    src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, lvl_shift1_8x16b);
                    src_temp3_8x16b = _mm_adds_epi16(src_temp3_8x16b, lvl_shift1_8x16b);
                    src_temp5_8x16b = _mm_adds_epi16(src_temp5_8x16b, lvl_shift1_8x16b);
                    src_temp7_8x16b = _mm_adds_epi16(src_temp7_8x16b, lvl_shift1_8x16b);

                    /* (i4_tmp >> shift) */
                    src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  shift);
                    src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  shift);
                    src_temp5_8x16b = _mm_srai_epi16(src_temp5_8x16b,  shift);
                    src_temp7_8x16b = _mm_srai_epi16(src_temp7_8x16b,  shift);

                    /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */
                    src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp1_8x16b);
                    src_temp3_8x16b = _mm_packus_epi16(src_temp3_8x16b, src_temp3_8x16b);
                    src_temp5_8x16b = _mm_packus_epi16(src_temp5_8x16b, src_temp5_8x16b);
                    src_temp7_8x16b = _mm_packus_epi16(src_temp7_8x16b, src_temp7_8x16b);

                    /* store four 8-bit output values  */
                    _mm_storel_epi64((__m128i *)(pu1_dst + 0 * dst_strd), src_temp1_8x16b); /* row = 0*/
                    _mm_storel_epi64((__m128i *)(pu1_dst + 1 * dst_strd), src_temp3_8x16b); /* row = 2*/
                    _mm_storel_epi64((__m128i *)(pu1_dst + 2 * dst_strd), src_temp5_8x16b); /* row = 1*/
                    _mm_storel_epi64((__m128i *)(pu1_dst + 3 * dst_strd), src_temp7_8x16b); /* row = 3*/

                    /* To update pointer */
                    pi2_src1 += 8;
                    pi2_src2 += 8;
                    pu1_dst  += 8;

                } /* inner loop ends here(8-output values in single iteration) */

                pi2_src1 = pi2_src1 - wd + 4 * src_strd1;  /* Pointer update */
                pi2_src2 = pi2_src2 - wd + 4 * src_strd2;  /* Pointer update */
                pu1_dst  = pu1_dst - wd + 4 * dst_strd;   /* Pointer update */

            }
        }
        else /* wd multiple of 4 case*/
        {
            WORD32 dst0, dst1, dst2, dst3;

            /*  outer for loop starts from here */
            for(row = 0; row < ht; row += 4)
            {
                for(col = 0; col < wd; col += 4)
                {
                    /*load 4 pixel values from 7:0 pos. relative to cur. pos.*/
                    src_temp1_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1));
                    /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                    src_temp2_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2));

                    /* row = 1 */
                    src_temp3_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1 + src_strd1));
                    src_temp4_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2 + src_strd2));
                    /* row = 2 */
                    src_temp5_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1 + 2 * src_strd1));
                    src_temp6_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2 + 2 * src_strd2));
                    /* row = 3 */
                    src_temp7_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1 + 3 * src_strd1));
                    src_temp8_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2 + 3 * src_strd2));

                    /* Pack two rows together */
                    src_temp1_8x16b = _mm_unpacklo_epi64(src_temp1_8x16b, src_temp3_8x16b);
                    src_temp2_8x16b = _mm_unpacklo_epi64(src_temp2_8x16b, src_temp4_8x16b);
                    src_temp5_8x16b = _mm_unpacklo_epi64(src_temp5_8x16b, src_temp7_8x16b);
                    src_temp6_8x16b = _mm_unpacklo_epi64(src_temp6_8x16b, src_temp8_8x16b);

                    /* (pi2_src1[col] + pi2_src2[col]) */
                    src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, src_temp2_8x16b);
                    src_temp5_8x16b = _mm_adds_epi16(src_temp5_8x16b, src_temp6_8x16b);

                    /* i4_tmp = (pi2_src1[col] + pi2_src2[col] + lvl_shift1 + lvl_shift2 + shift_value) */
                    src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, lvl_shift1_8x16b);
                    src_temp5_8x16b = _mm_adds_epi16(src_temp5_8x16b, lvl_shift1_8x16b);

                    /* (i4_tmp >> shift) */
                    src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  shift);
                    src_temp5_8x16b = _mm_srai_epi16(src_temp5_8x16b,  shift);

                    /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */
                    src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp1_8x16b);
                    src_temp5_8x16b = _mm_packus_epi16(src_temp5_8x16b, src_temp5_8x16b);

                    dst0 = _mm_cvtsi128_si32(src_temp1_8x16b);
                    /* dst row = 1 to 3 */
                    src_temp2_8x16b = _mm_shuffle_epi32(src_temp1_8x16b, 1);
                    src_temp4_8x16b = _mm_shuffle_epi32(src_temp5_8x16b, 1);

                    /* store four 8-bit output values  */
                    *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0;

                    dst1 = _mm_cvtsi128_si32(src_temp2_8x16b);
                    dst2 = _mm_cvtsi128_si32(src_temp5_8x16b);
                    dst3 = _mm_cvtsi128_si32(src_temp4_8x16b);

                    /* row = 1 to row = 3 */
                    *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1;
                    *(WORD32 *)(&pu1_dst[2 * dst_strd]) = dst2;
                    *(WORD32 *)(&pu1_dst[3 * dst_strd]) = dst3;

                    /* To update pointer */
                    pi2_src1 += 4;
                    pi2_src2 += 4;
                    pu1_dst  += 4;

                } /* inner loop ends here(4-output values in single iteration) */

                pi2_src1 = pi2_src1 - wd + 4 * src_strd1; /* Pointer update */
                pi2_src2 = pi2_src2 - wd + 4 * src_strd2; /* Pointer update */
                pu1_dst  = pu1_dst  - wd + 4 * dst_strd;  /* Pointer update */

            }
        }
    }
    else /* ht multiple of 2 case and wd multiple of 4 case*/
    {

        WORD32 dst0, dst1;

        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 2)
        {
            for(col = 0; col < wd; col += 4)
            {
                /*load 4 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp1_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1));
                /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp2_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2));

                /* row = 1 */
                src_temp3_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1 + src_strd1));
                src_temp4_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2 + src_strd2));

                /* Pack two rows together */
                src_temp1_8x16b = _mm_unpacklo_epi64(src_temp1_8x16b, src_temp3_8x16b);
                src_temp2_8x16b = _mm_unpacklo_epi64(src_temp2_8x16b, src_temp4_8x16b);

                /* (pi2_src1[col] + pi2_src2[col]) */
                src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, src_temp2_8x16b);

                /* i4_tmp = (pi2_src1[col] + pi2_src2[col] + lvl_shift1 + lvl_shift2 + shift_value) */
                src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, lvl_shift1_8x16b);

                /* (i4_tmp >> shift) */
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  shift);

                /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp1_8x16b);

                dst0 = _mm_cvtsi128_si32(src_temp1_8x16b);
                /* dst row = 1 to 3 */
                src_temp2_8x16b = _mm_shuffle_epi32(src_temp1_8x16b, 1);

                /* store four 8-bit output values  */
                *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0;

                dst1 = _mm_cvtsi128_si32(src_temp2_8x16b);

                /* row = 1 to row = 3 */
                *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1;

                /* To update pointer */
                pi2_src1 += 4;
                pi2_src2 += 4;
                pu1_dst  += 4;

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src1 = pi2_src1 - wd + 2 * src_strd1; /* Pointer update */
            pi2_src2 = pi2_src2 - wd + 2 * src_strd2; /* Pointer update */
            pu1_dst  = pu1_dst  - wd + 2 * dst_strd;  /* Pointer update */

        }

    }

}